

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigStrSim.c
# Opt level: O0

void Saig_StrSimulateRound(Aig_Man_t *p0,Aig_Man_t *p1)

{
  Vec_Ptr_t *pVVar1;
  int iVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  int local_30;
  int local_2c;
  int i;
  int f;
  Aig_Obj_t *pObj1;
  Aig_Obj_t *pObj0;
  Aig_Man_t *p1_local;
  Aig_Man_t *p0_local;
  
  local_30 = 0;
  do {
    iVar2 = Vec_PtrSize(p0->vObjs);
    if (iVar2 <= local_30) {
      for (local_2c = 0; local_2c < 0x10; local_2c = local_2c + 1) {
        for (local_30 = 0; iVar2 = Vec_PtrSize(p0->vObjs), local_30 < iVar2; local_30 = local_30 + 1
            ) {
          pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p0->vObjs,local_30);
          if (((pAVar3 != (Aig_Obj_t *)0x0) && (iVar2 = Aig_ObjIsNode(pAVar3), iVar2 != 0)) &&
             (pAVar5 = Aig_ObjRepr(p0,pAVar3), pAVar5 == (Aig_Obj_t *)0x0)) {
            Saig_StrSimulateNode(pAVar3,local_2c);
          }
        }
        for (local_30 = 0; iVar2 = Saig_ManRegNum(p0), local_30 < iVar2; local_30 = local_30 + 1) {
          pVVar1 = p0->vCos;
          iVar2 = Saig_ManPoNum(p0);
          pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(pVVar1,local_30 + iVar2);
          Saig_StrSimSaveOutput(pAVar3,local_2c);
        }
        if (local_2c < 0xf) {
          for (local_30 = 0; iVar2 = Saig_ManRegNum(p0), local_30 < iVar2; local_30 = local_30 + 1)
          {
            pAVar3 = Saig_ManLi(p0,local_30);
            pAVar5 = Saig_ManLo(p0,local_30);
            Saig_StrSimTransferNext(pAVar3,pAVar5,local_2c);
          }
        }
        for (local_30 = 0; iVar2 = Vec_PtrSize(p1->vObjs), local_30 < iVar2; local_30 = local_30 + 1
            ) {
          pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p1->vObjs,local_30);
          if (((pAVar3 != (Aig_Obj_t *)0x0) && (iVar2 = Aig_ObjIsNode(pAVar3), iVar2 != 0)) &&
             (pAVar5 = Aig_ObjRepr(p1,pAVar3), pAVar5 == (Aig_Obj_t *)0x0)) {
            Saig_StrSimulateNode(pAVar3,local_2c);
          }
        }
        for (local_30 = 0; iVar2 = Saig_ManRegNum(p1), local_30 < iVar2; local_30 = local_30 + 1) {
          pVVar1 = p1->vCos;
          iVar2 = Saig_ManPoNum(p1);
          pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(pVVar1,local_30 + iVar2);
          Saig_StrSimSaveOutput(pAVar3,local_2c);
        }
        if (local_2c < 0xf) {
          for (local_30 = 0; iVar2 = Saig_ManRegNum(p1), local_30 < iVar2; local_30 = local_30 + 1)
          {
            pAVar3 = Saig_ManLi(p1,local_30);
            pAVar5 = Saig_ManLo(p1,local_30);
            Saig_StrSimTransferNext(pAVar3,pAVar5,local_2c);
          }
        }
      }
      return;
    }
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p0->vObjs,local_30);
    if (((pAVar3 != (Aig_Obj_t *)0x0) &&
        ((iVar2 = Aig_ObjIsCi(pAVar3), iVar2 != 0 || (iVar2 = Aig_ObjIsNode(pAVar3), iVar2 != 0))))
       && (pAVar5 = Aig_ObjRepr(p0,pAVar3), pAVar5 != (Aig_Obj_t *)0x0)) {
      pAVar4 = Aig_ObjRepr(p1,pAVar5);
      if (pAVar4 != pAVar3) {
        __assert_fail("Aig_ObjRepr(p1, pObj1) == pObj0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigStrSim.c"
                      ,0x132,"void Saig_StrSimulateRound(Aig_Man_t *, Aig_Man_t *)");
      }
      Saig_StrSimAssignRandom(pAVar3);
      Saig_StrSimTransfer(pAVar3,pAVar5);
    }
    local_30 = local_30 + 1;
  } while( true );
}

Assistant:

void Saig_StrSimulateRound( Aig_Man_t * p0, Aig_Man_t * p1 )
{
    Aig_Obj_t * pObj0, * pObj1;
    int f, i;
    // simulate the nodes
    Aig_ManForEachObj( p0, pObj0, i )
    {
        if ( !Aig_ObjIsCi(pObj0) && !Aig_ObjIsNode(pObj0) )
           continue;
        pObj1 = Aig_ObjRepr(p0, pObj0);
        if ( pObj1 == NULL )
            continue;
        assert( Aig_ObjRepr(p1, pObj1) == pObj0 );
        Saig_StrSimAssignRandom( pObj0 );
        Saig_StrSimTransfer( pObj0, pObj1 );
    }
    // simulate the timeframes
    for ( f = 0; f < SAIG_WORDS; f++ )
    {
        // simulate the first AIG
        Aig_ManForEachNode( p0, pObj0, i )
            if ( Aig_ObjRepr(p0, pObj0) == NULL )
                Saig_StrSimulateNode( pObj0, f );
        Saig_ManForEachLi( p0, pObj0, i )
            Saig_StrSimSaveOutput( pObj0, f );
        if ( f < SAIG_WORDS - 1 )
            Saig_ManForEachLiLo( p0, pObj0, pObj1, i )
                Saig_StrSimTransferNext( pObj0, pObj1, f );
        // simulate the second AIG
        Aig_ManForEachNode( p1, pObj1, i )
            if ( Aig_ObjRepr(p1, pObj1) == NULL )
                Saig_StrSimulateNode( pObj1, f );
        Saig_ManForEachLi( p1, pObj1, i )
            Saig_StrSimSaveOutput( pObj1, f );
        if ( f < SAIG_WORDS - 1 )
            Saig_ManForEachLiLo( p1, pObj1, pObj0, i )
                Saig_StrSimTransferNext( pObj1, pObj0, f );
    }
}